

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

void __thiscall
icu_63::StringLocalizationInfo::~StringLocalizationInfo(StringLocalizationInfo *this)

{
  UChar **buffer;
  UChar ***buffer_00;
  
  (this->super_LocalizationInfo)._vptr_LocalizationInfo =
       (_func_int **)&PTR__StringLocalizationInfo_003a54c0;
  buffer_00 = this->data;
  buffer = *buffer_00;
  if (buffer != (UChar **)0x0) {
    do {
      buffer_00 = buffer_00 + 1;
      uprv_free_63(buffer);
      buffer = *buffer_00;
    } while (buffer != (UChar **)0x0);
    buffer_00 = this->data;
    if (buffer_00 == (UChar ***)0x0) goto LAB_00213df5;
  }
  uprv_free_63(buffer_00);
LAB_00213df5:
  if (this->info != (UChar *)0x0) {
    uprv_free_63(this->info);
  }
  return;
}

Assistant:

StringLocalizationInfo::~StringLocalizationInfo() {
    for (UChar*** p = (UChar***)data; *p; ++p) {
        // remaining data is simply pointer into our unicode string data.
        if (*p) uprv_free(*p);
    }
    if (data) uprv_free(data);
    if (info) uprv_free(info);
}